

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O3

void ly_ilo_change(ly_ctx *ctx,int_log_opts new_ilo,int_log_opts *prev_ilo,
                  ly_err_item **prev_last_eitem)

{
  int_log_opts *piVar1;
  ly_err_item *plVar2;
  
  if (prev_ilo == (int_log_opts *)0x0) {
    __assert_fail("prev_ilo",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/log.c"
                  ,0x3fe,
                  "void ly_ilo_change(struct ly_ctx *, enum int_log_opts, enum int_log_opts *, struct ly_err_item **)"
                 );
  }
  piVar1 = (int_log_opts *)__tls_get_addr(&PTR_001ccfc8);
  *prev_ilo = *piVar1;
  if (new_ilo == ILO_STORE) {
    if ((ctx == (ly_ctx *)0x0) || (prev_last_eitem == (ly_err_item **)0x0)) {
      __assert_fail("ctx && prev_last_eitem",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/log.c"
                    ,0x403,
                    "void ly_ilo_change(struct ly_ctx *, enum int_log_opts, enum int_log_opts *, struct ly_err_item **)"
                   );
    }
    plVar2 = ly_err_first(ctx);
    *prev_last_eitem = plVar2;
    if (plVar2 != (ly_err_item *)0x0) {
      *prev_last_eitem = plVar2->prev;
    }
  }
  if (*piVar1 != ILO_IGNORE) {
    *piVar1 = new_ilo;
  }
  return;
}

Assistant:

void
ly_ilo_change(struct ly_ctx *ctx, enum int_log_opts new_ilo, enum int_log_opts *prev_ilo, struct ly_err_item **prev_last_eitem)
{
    assert(prev_ilo);

    *prev_ilo = log_opt;
    if (new_ilo == ILO_STORE) {
        /* only in this case the errors are only temporarily stored */
        assert(ctx && prev_last_eitem);
        *prev_last_eitem = (struct ly_err_item *)ly_err_first(ctx);
        if (*prev_last_eitem) {
            *prev_last_eitem = (*prev_last_eitem)->prev;
        }
    }

    if (log_opt != ILO_IGNORE) {
        log_opt = new_ilo;
    } /* else we can just keep it, useless to change it */
}